

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

void * hugeOpen(char *URI)

{
  xmlHugeDocParts *pxVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  long lVar4;
  xmlHugeDocParts *pxVar5;
  
  if (URI == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    lVar4 = 3;
    pxVar1 = (xmlHugeDocParts *)&testDescriptions[0xb].out;
    do {
      pxVar5 = pxVar1;
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) {
        return (void *)0x0;
      }
      iVar2 = strcmp(URI,pxVar5[1].URL);
      pxVar1 = pxVar5 + 1;
    } while (iVar2 != 0);
    curseg = 0;
    __s = pxVar5[1].start;
    hugeDocParts = pxVar5 + 1;
    current = __s;
    sVar3 = strlen(__s);
    rlen = (int)sVar3;
  }
  return __s;
}

Assistant:

static void *
hugeOpen(const char * URI) {
    int i;

    if (URI == NULL)
        return(NULL);

    for (i = 0; hugeDocTable[i].URL; i++) {
        if (strcmp(URI, hugeDocTable[i].URL) == 0) {
            hugeDocParts = hugeDocTable + i;
            curseg = 0;
            current = hugeDocParts->start;
            rlen = strlen(current);
            return((void *) current);
        }
    }

    return(NULL);
}